

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

Elem * new_ident(char *s,char *e,Rule *r)

{
  Elem **ppEVar1;
  uint uVar2;
  Elem **ppEVar3;
  Elem *elem;
  char *__s;
  size_t sVar4;
  anon_struct_40_4_d8687ec6_for_elems *v;
  
  elem = new_elem();
  elem->kind = ELEM_UNRESOLVED;
  __s = dup_str(s,e);
  (elem->e).unresolved.string = __s;
  sVar4 = strlen(__s);
  (elem->e).unresolved.len = (uint)sVar4;
  elem->rule = r;
  if (r == (Rule *)0x0) {
    return elem;
  }
  ppEVar3 = (r->elems).v;
  ppEVar1 = (r->elems).e;
  if (ppEVar3 == (Elem **)0x0) {
    (r->elems).v = ppEVar1;
    uVar2 = (r->elems).n;
    (r->elems).n = uVar2 + 1;
    (r->elems).e[uVar2] = elem;
    return elem;
  }
  v = &r->elems;
  uVar2 = v->n;
  if (ppEVar3 == ppEVar1) {
    if (2 < uVar2) goto LAB_0013a007;
  }
  else if ((uVar2 & 7) == 0) {
LAB_0013a007:
    vec_add_internal(v,elem);
    return elem;
  }
  v->n = uVar2 + 1;
  ppEVar3[uVar2] = elem;
  return elem;
}

Assistant:

Elem *new_ident(char *s, char *e, Rule *r) {
  Elem *x = new_elem();
  x->kind = ELEM_UNRESOLVED;
  x->e.unresolved.string = dup_str(s, e);
  x->e.unresolved.len = strlen(x->e.unresolved.string);
  x->rule = r;
  if (r) vec_add(&r->elems, x);
  return x;
}